

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DateTruncBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  DatePartSpecifier type;
  int iVar3;
  reference pvVar4;
  pointer pEVar5;
  type expr;
  reference pvVar6;
  undefined **ppuVar7;
  function_statistics_t p_Var8;
  NotImplementedException *pNVar9;
  string part_name;
  Value part_value;
  string local_a8;
  string local_88;
  Value local_68;
  
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  iVar3 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar5);
  if ((char)iVar3 == '\0') {
    *(undefined8 *)this = 0;
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar4);
    ExpressionExecutor::EvaluateScalar(&local_68,context,expr,false);
    if (local_68.is_null == true) {
      *(undefined8 *)this = 0;
    }
    else {
      Value::ToString_abi_cxx11_(&local_88,&local_68);
      type = GetDatePartSpecifier(&local_88);
      if ((type < BEGIN_INVALID) && ((0x83f83fU >> (type & 0x1f) & 1) != 0)) {
        pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,1);
        if (pvVar6->id_ == DATE) {
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    &bound_function->function,DateTruncFunction<duckdb::date_t,duckdb::date_t>);
          if ((JULIAN_DAY < type) || ((0xc3ffffU >> (type & 0x1f) & 1) == 0)) {
            pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Specifier type not implemented for DATETRUNC statistics"
                       ,"");
            NotImplementedException::NotImplementedException(pNVar9,&local_a8);
            __cxa_throw(pNVar9,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ppuVar7 = &
                    PTR_PropagateDateTruncStatistics<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>_0247a0b0
          ;
        }
        else {
          if (pvVar6->id_ != TIMESTAMP) {
            pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Temporal argument type for DATETRUNC","");
            NotImplementedException::NotImplementedException(pNVar9,&local_a8);
            __cxa_throw(pNVar9,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    &bound_function->function,DateTruncFunction<duckdb::timestamp_t,duckdb::date_t>)
          ;
          if ((JULIAN_DAY < type) || ((0xc3ffffU >> (type & 0x1f) & 1) == 0)) {
            pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Specifier type not implemented for DATETRUNC statistics"
                       ,"");
            NotImplementedException::NotImplementedException(pNVar9,&local_a8);
            __cxa_throw(pNVar9,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ppuVar7 = &
                    PTR_PropagateDateTruncStatistics<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>_02479ff0
          ;
        }
        bound_function->statistics = (function_statistics_t)ppuVar7[(char)type];
        LogicalType::LogicalType((LogicalType *)&local_a8,DATE);
        (bound_function->super_BaseScalarFunction).return_type.id_ =
             (LogicalTypeId)local_a8._M_dataplus._M_p;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             local_a8._M_dataplus._M_p._1_1_;
        peVar1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a8._M_string_length;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity;
        local_a8._M_string_length = (size_type)peVar1;
        local_a8.field_2._M_allocated_capacity = (size_type)p_Var2;
        LogicalType::~LogicalType((LogicalType *)&local_a8);
      }
      else {
        pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,1);
        if (pvVar6->id_ == DATE) {
          p_Var8 = __duckdb__DateTruncStats<duckdb::date_t,duckdb::timestamp_t>_duckdb__DatePartSpecifier__
                             (type);
        }
        else {
          if (pvVar6->id_ != TIMESTAMP) {
            pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"Temporal argument type for DATETRUNC","");
            NotImplementedException::NotImplementedException(pNVar9,&local_a8);
            __cxa_throw(pNVar9,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          p_Var8 = __duckdb__DateTruncStats<duckdb::timestamp_t,duckdb::timestamp_t>_duckdb__DatePartSpecifier__
                             (type);
        }
        bound_function->statistics = p_Var8;
      }
      *(undefined8 *)this = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    Value::~Value(&local_68);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DateTruncBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	if (!arguments[0]->IsFoldable()) {
		return nullptr;
	}

	// Rebind to return a date if we are truncating that far
	Value part_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	if (part_value.IsNull()) {
		return nullptr;
	}
	const auto part_name = part_value.ToString();
	const auto part_code = GetDatePartSpecifier(part_name);
	switch (part_code) {
	case DatePartSpecifier::MILLENNIUM:
	case DatePartSpecifier::CENTURY:
	case DatePartSpecifier::DECADE:
	case DatePartSpecifier::YEAR:
	case DatePartSpecifier::QUARTER:
	case DatePartSpecifier::MONTH:
	case DatePartSpecifier::WEEK:
	case DatePartSpecifier::YEARWEEK:
	case DatePartSpecifier::ISOYEAR:
	case DatePartSpecifier::DAY:
	case DatePartSpecifier::DOW:
	case DatePartSpecifier::ISODOW:
	case DatePartSpecifier::DOY:
	case DatePartSpecifier::JULIAN_DAY:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.function = DateTruncFunction<timestamp_t, date_t>;
			bound_function.statistics = DateTruncStats<timestamp_t, date_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.function = DateTruncFunction<date_t, date_t>;
			bound_function.statistics = DateTruncStats<date_t, date_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		bound_function.return_type = LogicalType::DATE;
		break;
	default:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.statistics = DateTruncStats<timestamp_t, timestamp_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.statistics = DateTruncStats<date_t, timestamp_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		break;
	}

	return nullptr;
}